

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O2

void __thiscall phmap::priv::anon_unknown_0::PropagateTest<6>::PropagateTest(PropagateTest<6> *this)

{
  tuple<unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  *ptVar1;
  AssertionResult *pAVar2;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *lhs;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *value;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> *value_00;
  char *pcVar3;
  shared_ptr<phmap::priv::(anonymous_namespace)::AllocState> sVar4;
  undefined1 local_c0 [32];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  CheckedAlloc<phmap::priv::Tracked<int>,_6> local_70;
  AssertionResult local_58;
  char *local_48;
  char *local_40;
  char *local_38;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PropagateTest_00164ea0;
  (this->a1).id_ = 1;
  sVar4 = std::make_shared<phmap::priv::(anonymous_namespace)::AllocState>();
  lhs = &this->a1;
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::raw_hash_set(&this->t1,(size_t)lhs,
                 (allocator_type *)
                 sVar4.
                 super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi._M_pi);
  (this->a2).id_ = 2;
  std::make_shared<phmap::priv::(anonymous_namespace)::AllocState>();
  ptVar1 = &(this->t1).settings_;
  CheckedAlloc<phmap::priv::Tracked<int>,_6>::CheckedAlloc
            ((CheckedAlloc<phmap::priv::Tracked<int>,_6> *)local_c0,
             (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)ptVar1);
  testing::internal::EqHelper::
  Compare<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_nullptr>
            ((EqHelper *)&gtest_ar,"a1","t1.get_allocator()",lhs,
             (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 0x10));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    lhs = (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)0xb4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_c0._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_c0._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  CheckedAlloc<phmap::priv::Tracked<int>,_6>::CheckedAlloc
            (&local_70,(CheckedAlloc<phmap::priv::Tracked<int>,_6> *)ptVar1);
  if ((this->a2).id_ == local_70.id_) {
    local_38 = "a2";
    local_40 = "t1.get_allocator()";
    local_48 = "!=";
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<(&local_58,(char (*) [12])"Expected: (");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_38);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [3])") ");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [3])0x143b4c);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
              ((string *)local_c0,(internal *)&this->a2,value,lhs);
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>,phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,6>>
              ((string *)&gtest_ar,(internal *)&local_70,value_00,lhs);
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &gtest_ar);
    testing::AssertionResult::AssertionResult(&gtest_ar_1,pAVar2);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::__cxx11::string::~string((string *)local_c0);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_58.message_);
  }
  else {
    testing::AssertionSuccess();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.state_.
              super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xb5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_c0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

PropagateTest() {
    EXPECT_EQ(a1, t1.get_allocator());
    EXPECT_NE(a2, t1.get_allocator());
  }